

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Inlining::prepare(Inlining *this)

{
  Module *this_00;
  bool bVar1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_01;
  pointer __k;
  PassRunner *runner;
  pointer pEVar2;
  Name *__k_00;
  mapped_type *pmVar3;
  unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
  local_1a8;
  PassOptions *local_1a0;
  PassOptions *options;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2_1;
  undefined1 local_168 [8];
  FunctionInfoScanner scanner;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  Inlining *this_local;
  
  std::
  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
  ::clear(&this->infos);
  this_01 = &this->module->functions;
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(this_01);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&func), bVar1) {
    scanner.infos =
         (NameInfoMap *)
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
         ::operator*(&__end2);
    __k = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                    ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                     scanner.infos);
    std::
    unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
    ::operator[](&this->infos,(key_type *)__k);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  FunctionInfoScanner::FunctionInfoScanner((FunctionInfoScanner *)local_168,&this->infos);
  runner = Pass::getPassRunner(&this->super_Pass);
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
         *)local_168,runner,this->module);
  Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
  ::walkModuleCode((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                    *)((long)&scanner.
                              super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                              .super_Pass.passArg.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      + 0x20),this->module);
  FunctionInfoScanner::~FunctionInfoScanner((FunctionInfoScanner *)local_168);
  this_00 = this->module;
  __end2_1 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin(&this_00->exports);
  ex = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
       std::
       vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ::end(&this_00->exports);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                             *)&ex), bVar1) {
    options = (PassOptions *)
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end2_1);
    pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                       ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)options);
    if (pEVar2->kind == Function) {
      pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)options);
      __k_00 = Export::getInternalName(pEVar2);
      pmVar3 = std::
               unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
               ::operator[](&this->infos,__k_00);
      pmVar3->usedGlobally = true;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2_1);
  }
  bVar1 = IString::is(&(this->module->start).super_IString);
  if (bVar1) {
    pmVar3 = std::
             unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
             ::operator[](&this->infos,&this->module->start);
    pmVar3->usedGlobally = true;
  }
  local_1a0 = Pass::getPassOptions(&this->super_Pass);
  if (((2 < local_1a0->optimizeLevel) && (local_1a0->shrinkLevel == 0)) &&
     ((local_1a0->inlining).partialInliningIfs != 0)) {
    std::
    make_unique<wasm::(anonymous_namespace)::FunctionSplitter,wasm::Module*&,wasm::PassOptions&>
              ((Module **)&local_1a8,(PassOptions *)&this->module);
    std::
    unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
    ::operator=(&this->functionSplitter,&local_1a8);
    std::
    unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
    ::~unique_ptr(&local_1a8);
  }
  return;
}

Assistant:

void prepare() {
    infos.clear();
    // fill in info, as we operate on it in parallel (each function to its own
    // entry)
    for (auto& func : module->functions) {
      infos[func->name];
    }
    {
      FunctionInfoScanner scanner(infos);
      scanner.run(getPassRunner(), module);
      scanner.walkModuleCode(module);
    }
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function) {
        infos[*ex->getInternalName()].usedGlobally = true;
      }
    }
    if (module->start.is()) {
      infos[module->start].usedGlobally = true;
    }

    // When optimizing heavily for size, we may potentially split functions in
    // order to inline parts of them, if partialInliningIfs is enabled.
    auto& options = getPassOptions();
    if (options.optimizeLevel >= 3 && !options.shrinkLevel &&
        options.inlining.partialInliningIfs) {
      functionSplitter = std::make_unique<FunctionSplitter>(module, options);
    }
  }